

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

void __thiscall
llvm::APInt::toString
          (APInt *this,SmallVectorImpl<char> *Str,uint Radix,bool Signed,bool formatAsCLiteral)

{
  char cVar1;
  undefined1 uVar2;
  ulong uVar3;
  void *pvVar4;
  long lVar5;
  bool bVar6;
  uint uVar7;
  ulong uVar8;
  undefined1 *puVar9;
  int iVar10;
  anon_union_8_2_1313ab2f_for_U aVar11;
  undefined1 *puVar12;
  undefined1 *puVar13;
  ulong uVar14;
  char *pcVar15;
  uint uVar16;
  uint uVar17;
  char *pcVar18;
  uint64_t Digit;
  APInt Tmp;
  uint64_t local_88;
  APInt *local_80;
  anon_union_8_2_1313ab2f_for_U local_78;
  uint local_70;
  char local_38 [8];
  
  if ((0x24 < Radix) || (uVar14 = (ulong)Radix, (0x1000010504U >> (uVar14 & 0x3f) & 1) == 0)) {
    __assert_fail("(Radix == 10 || Radix == 8 || Radix == 16 || Radix == 2 || Radix == 36) && \"Radix should be 2, 8, 10, 16, or 36!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x7e2,
                  "void llvm::APInt::toString(SmallVectorImpl<char> &, unsigned int, bool, bool) const"
                 );
  }
  if (formatAsCLiteral) {
    if ((0xf < Radix - 2) || (uVar7 = Radix - 2 >> 1, (0x99U >> (uVar7 & 0x1f) & 1) == 0)) {
      llvm_unreachable_internal
                ("Invalid radix!",
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                 ,0x7f5);
    }
    pcVar18 = &DAT_00212020 + *(int *)(&DAT_00212020 + (ulong)uVar7 * 4);
  }
  else {
    pcVar18 = "";
  }
  bVar6 = operator==(this,0);
  if (bVar6) {
    cVar1 = *pcVar18;
    while (cVar1 != '\0') {
      SmallVectorTemplateBase<char,_true>::push_back
                (&Str->super_SmallVectorTemplateBase<char,_true>,pcVar18);
      pcVar15 = pcVar18 + 1;
      pcVar18 = pcVar18 + 1;
      cVar1 = *pcVar15;
    }
    local_78.VAL._1_7_ = (undefined7)((ulong)local_78 >> 8);
    local_78.VAL._0_1_ = 0x30;
    SmallVectorTemplateBase<char,_true>::push_back
              (&Str->super_SmallVectorTemplateBase<char,_true>,(char *)&local_78.VAL);
  }
  else {
    uVar7 = this->BitWidth;
    if (0x40 < (ulong)uVar7) {
      uVar8 = (ulong)((uint)((ulong)uVar7 + 0x3f >> 3) & 0xfffffff8);
      local_80 = this;
      local_70 = uVar7;
      local_78.pVal = (uint64_t *)operator_new__(uVar8);
      memcpy(local_78.pVal,(local_80->U).pVal,uVar8);
      if ((Signed) && (bVar6 = operator[](local_80,uVar7 - 1), bVar6)) {
        flipAllBits((APInt *)&local_78);
        operator++((APInt *)&local_78);
        local_88._0_1_ = '-';
        SmallVectorTemplateBase<char,_true>::push_back
                  (&Str->super_SmallVectorTemplateBase<char,_true>,(char *)&local_88);
      }
      cVar1 = *pcVar18;
      while (cVar1 != '\0') {
        SmallVectorTemplateBase<char,_true>::push_back
                  (&Str->super_SmallVectorTemplateBase<char,_true>,pcVar18);
        pcVar15 = pcVar18 + 1;
        pcVar18 = pcVar18 + 1;
        cVar1 = *pcVar15;
      }
      uVar7 = (Str->super_SmallVectorTemplateBase<char,_true>).
              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
      if ((Radix == 2) || (Radix == 8)) {
        uVar16 = (uint)(Radix == 8) * 2 + 1;
      }
      else {
        uVar16 = 4;
        if (Radix != 0x10) {
          do {
            if ((ulong)local_70 < 0x41) {
              bVar6 = (anon_union_8_2_1313ab2f_for_U *)local_78.VAL ==
                      (anon_union_8_2_1313ab2f_for_U *)0x0;
            }
            else {
              uVar8 = (ulong)local_70 + 0x3f >> 6;
              iVar10 = 0;
              do {
                if ((long)uVar8 < 1) break;
                uVar3 = ((anon_union_8_2_1313ab2f_for_U *)(local_78.VAL - 8))[uVar8].VAL;
                if (uVar3 == 0) {
                  uVar16 = 0x40;
                }
                else {
                  lVar5 = 0x3f;
                  if (uVar3 != 0) {
                    for (; uVar3 >> lVar5 == 0; lVar5 = lVar5 + -1) {
                    }
                  }
                  uVar16 = (uint)lVar5 ^ 0x3f;
                }
                uVar8 = uVar8 - 1;
                iVar10 = iVar10 + uVar16;
              } while (uVar3 == 0);
              uVar16 = local_70 | 0xffffffc0;
              if ((local_70 & 0x3f) == 0) {
                uVar16 = 0;
              }
              bVar6 = uVar16 + iVar10 == local_70;
            }
            if (bVar6) goto LAB_001c65fa;
            udivrem((APInt *)&local_78,uVar14,(APInt *)&local_78,&local_88);
            if (uVar14 <= CONCAT71(local_88._1_7_,(char)local_88)) {
              __assert_fail("Digit < Radix && \"divide failed\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                            ,0x846,
                            "void llvm::APInt::toString(SmallVectorImpl<char> &, unsigned int, bool, bool) const"
                           );
            }
            SmallVectorTemplateBase<char,_true>::push_back
                      (&Str->super_SmallVectorTemplateBase<char,_true>,
                       "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ" +
                       CONCAT71(local_88._1_7_,(char)local_88));
          } while( true );
        }
      }
      do {
        if ((ulong)local_70 < 0x41) {
          bVar6 = (anon_union_8_2_1313ab2f_for_U *)local_78.VAL ==
                  (anon_union_8_2_1313ab2f_for_U *)0x0;
        }
        else {
          uVar14 = (ulong)local_70 + 0x3f >> 6;
          iVar10 = 0;
          do {
            if ((long)uVar14 < 1) break;
            uVar8 = ((anon_union_8_2_1313ab2f_for_U *)(local_78.VAL - 8))[uVar14].VAL;
            if (uVar8 == 0) {
              uVar17 = 0x40;
            }
            else {
              lVar5 = 0x3f;
              if (uVar8 != 0) {
                for (; uVar8 >> lVar5 == 0; lVar5 = lVar5 + -1) {
                }
              }
              uVar17 = (uint)lVar5 ^ 0x3f;
            }
            uVar14 = uVar14 - 1;
            iVar10 = iVar10 + uVar17;
          } while (uVar8 == 0);
          uVar17 = local_70 | 0xffffffc0;
          if ((local_70 & 0x3f) == 0) {
            uVar17 = 0;
          }
          bVar6 = uVar17 + iVar10 == local_70;
        }
        if (bVar6) {
LAB_001c65fa:
          pvVar4 = (Str->super_SmallVectorTemplateBase<char,_true>).
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
          uVar16 = (Str->super_SmallVectorTemplateBase<char,_true>).
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
          puVar9 = (undefined1 *)((long)pvVar4 + ((ulong)uVar16 - 1));
          if ((undefined1 *)((long)pvVar4 + (ulong)uVar7) < puVar9 && uVar7 != uVar16) {
            puVar13 = (undefined1 *)((long)pvVar4 + (ulong)uVar7);
            do {
              puVar12 = puVar13 + 1;
              uVar2 = *puVar13;
              *puVar13 = *puVar9;
              *puVar9 = uVar2;
              puVar9 = puVar9 + -1;
              puVar13 = puVar12;
            } while (puVar12 < puVar9);
          }
          if (local_70 < 0x41) {
            return;
          }
          if ((anon_union_8_2_1313ab2f_for_U *)local_78.VAL == (anon_union_8_2_1313ab2f_for_U *)0x0)
          {
            return;
          }
          operator_delete__(local_78.pVal);
          return;
        }
        aVar11.pVal = (uint64_t *)&local_78;
        if (0x40 < local_70) {
          aVar11 = local_78;
        }
        SmallVectorTemplateBase<char,_true>::push_back
                  (&Str->super_SmallVectorTemplateBase<char,_true>,
                   "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ" + ((uint)*aVar11.pVal & Radix - 1));
        lshrInPlace((APInt *)&local_78,uVar16);
      } while( true );
    }
    if (Signed) {
      uVar8 = getSExtValue(this);
      if ((long)uVar8 < 0) {
        local_88._0_1_ = '-';
        SmallVectorTemplateBase<char,_true>::push_back
                  (&Str->super_SmallVectorTemplateBase<char,_true>,(char *)&local_88);
        uVar8 = -uVar8;
      }
    }
    else {
      uVar8 = getZExtValue(this);
    }
    cVar1 = *pcVar18;
    while (cVar1 != '\0') {
      SmallVectorTemplateBase<char,_true>::push_back
                (&Str->super_SmallVectorTemplateBase<char,_true>,pcVar18);
      pcVar15 = pcVar18 + 1;
      pcVar18 = pcVar18 + 1;
      cVar1 = *pcVar15;
    }
    pcVar18 = local_38 + 1;
    pcVar15 = pcVar18;
    if (uVar8 != 0) {
      do {
        pcVar15[-1] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[uVar8 % uVar14];
        pcVar15 = pcVar15 + -1;
        bVar6 = uVar14 <= uVar8;
        uVar8 = uVar8 / uVar14;
      } while (bVar6);
    }
    SmallVectorImpl<char>::append<char*,void>(Str,pcVar15,pcVar18);
  }
  return;
}

Assistant:

void APInt::toString(SmallVectorImpl<char> &Str, unsigned Radix,
                     bool Signed, bool formatAsCLiteral) const {
  assert((Radix == 10 || Radix == 8 || Radix == 16 || Radix == 2 ||
          Radix == 36) &&
         "Radix should be 2, 8, 10, 16, or 36!");

  const char *Prefix = "";
  if (formatAsCLiteral) {
    switch (Radix) {
      case 2:
        // Binary literals are a non-standard extension added in gcc 4.3:
        // http://gcc.gnu.org/onlinedocs/gcc-4.3.0/gcc/Binary-constants.html
        Prefix = "0b";
        break;
      case 8:
        Prefix = "0";
        break;
      case 10:
        break; // No prefix
      case 16:
        Prefix = "0x";
        break;
      default:
        llvm_unreachable("Invalid radix!");
    }
  }

  // First, check for a zero value and just short circuit the logic below.
  if (*this == 0) {
    while (*Prefix) {
      Str.push_back(*Prefix);
      ++Prefix;
    };
    Str.push_back('0');
    return;
  }

  static const char Digits[] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";

  if (isSingleWord()) {
    char Buffer[65];
    char *BufPtr = std::end(Buffer);

    uint64_t N;
    if (!Signed) {
      N = getZExtValue();
    } else {
      int64_t I = getSExtValue();
      if (I >= 0) {
        N = I;
      } else {
        Str.push_back('-');
        N = -(uint64_t)I;
      }
    }

    while (*Prefix) {
      Str.push_back(*Prefix);
      ++Prefix;
    };

    while (N) {
      *--BufPtr = Digits[N % Radix];
      N /= Radix;
    }
    Str.append(BufPtr, std::end(Buffer));
    return;
  }

  APInt Tmp(*this);

  if (Signed && isNegative()) {
    // They want to print the signed version and it is a negative value
    // Flip the bits and add one to turn it into the equivalent positive
    // value and put a '-' in the result.
    Tmp.negate();
    Str.push_back('-');
  }

  while (*Prefix) {
    Str.push_back(*Prefix);
    ++Prefix;
  };

  // We insert the digits backward, then reverse them to get the right order.
  unsigned StartDig = Str.size();

  // For the 2, 8 and 16 bit cases, we can just shift instead of divide
  // because the number of bits per digit (1, 3 and 4 respectively) divides
  // equally.  We just shift until the value is zero.
  if (Radix == 2 || Radix == 8 || Radix == 16) {
    // Just shift tmp right for each digit width until it becomes zero
    unsigned ShiftAmt = (Radix == 16 ? 4 : (Radix == 8 ? 3 : 1));
    unsigned MaskAmt = Radix - 1;

    while (Tmp.getBoolValue()) {
      unsigned Digit = unsigned(Tmp.getRawData()[0]) & MaskAmt;
      Str.push_back(Digits[Digit]);
      Tmp.lshrInPlace(ShiftAmt);
    }
  } else {
    while (Tmp.getBoolValue()) {
      uint64_t Digit;
      udivrem(Tmp, Radix, Tmp, Digit);
      assert(Digit < Radix && "divide failed");
      Str.push_back(Digits[Digit]);
    }
  }

  // Reverse the digits before returning.
  std::reverse(Str.begin()+StartDig, Str.end());
}